

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiDisplayTimingTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)23>_> *
vkt::wsi::anon_unknown_0::createFramebuffer
          (Move<vk::Handle<(vk::HandleType)23>_> *__return_storage_ptr__,DeviceInterface *vkd,
          VkDevice device,VkRenderPass renderPass,VkImageView imageView,deUint32 width,
          deUint32 height)

{
  undefined1 local_78 [8];
  VkFramebufferCreateInfo createInfo;
  deUint32 width_local;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  VkImageView imageView_local;
  VkRenderPass renderPass_local;
  
  local_78._0_4_ = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  createInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  createInfo._4_4_ = 0;
  createInfo.pNext._0_4_ = 0;
  createInfo.renderPass.m_internal._0_4_ = 1;
  createInfo._32_8_ = &vkd_local;
  createInfo.pAttachments._4_4_ = height;
  createInfo.width = 1;
  createInfo._16_8_ = renderPass.m_internal;
  createInfo.pAttachments._0_4_ = width;
  createInfo._60_4_ = width;
  vkd_local = (DeviceInterface *)imageView.m_internal;
  imageView_local.m_internal = renderPass.m_internal;
  ::vk::createFramebuffer
            (__return_storage_ptr__,vkd,device,(VkFramebufferCreateInfo *)local_78,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

vk::Move<vk::VkFramebuffer>	createFramebuffer (const vk::DeviceInterface&	vkd,
											   vk::VkDevice					device,
											   vk::VkRenderPass				renderPass,
											   vk::VkImageView				imageView,
											   deUint32						width,
											   deUint32						height)
{
	const vk::VkFramebufferCreateInfo createInfo =
	{
		vk::VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,
		DE_NULL,

		0u,
		renderPass,
		1u,
		&imageView,
		width,
		height,
		1u
	};

	return vk::createFramebuffer(vkd, device, &createInfo);
}